

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.h
# Opt level: O3

int can_ipv6(void)

{
  sa_family_t *psVar1;
  int iVar2;
  anon_union_28_2_e90107a3_for_address *paVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  int count;
  uv_interface_address_t *addr;
  int local_14;
  uv_interface_address_t *local_10;
  
  iVar2 = uv_interface_addresses(&local_10,&local_14);
  uVar5 = 0;
  if (iVar2 == 0) {
    if ((long)local_14 < 1) {
      uVar5 = 0;
    }
    else {
      paVar3 = &local_10->address;
      uVar4 = 1;
      do {
        psVar1 = &(paVar3->address4).sin_family;
        if (*psVar1 == 10) break;
        paVar3 = (anon_union_28_2_e90107a3_for_address *)((long)paVar3 + 0x50);
        bVar6 = uVar4 < (ulong)(long)local_14;
        uVar4 = uVar4 + 1;
      } while (bVar6);
      uVar5 = (uint)(*psVar1 == 10);
    }
    uv_free_interface_addresses(local_10,local_14);
  }
  return uVar5;
}

Assistant:

UNUSED static int can_ipv6(void) {
  uv_interface_address_t* addr;
  int supported;
  int count;
  int i;

  if (uv_interface_addresses(&addr, &count))
    return 0;  /* Assume no IPv6 support on failure. */

  supported = 0;
  for (i = 0; supported == 0 && i < count; i += 1)
    supported = (AF_INET6 == addr[i].address.address6.sin6_family);

  uv_free_interface_addresses(addr, count);
  return supported;
}